

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# number_decimalquantity.cpp
# Opt level: O0

void __thiscall icu_63::number::impl::DecimalQuantity::compact(DecimalQuantity *this)

{
  int iVar1;
  int8_t iVar2;
  bool bVar3;
  int local_20;
  int local_1c;
  int32_t leading_1;
  int32_t delta_1;
  int32_t leading;
  int32_t delta;
  DecimalQuantity *this_local;
  
  if ((this->usingBytes & 1U) == 0) {
    if ((this->fBCD).bcdBytes.ptr == (int8_t *)0x0) {
      setBcdToZero(this);
    }
    else {
      local_1c = 0;
      while( true ) {
        bVar3 = false;
        if (local_1c < this->precision) {
          iVar2 = getDigitPos(this,local_1c);
          bVar3 = iVar2 == '\0';
        }
        if (!bVar3) break;
        local_1c = local_1c + 1;
      }
      (this->fBCD).bcdLong = (this->fBCD).bcdLong >> ((byte)(local_1c << 2) & 0x3f);
      this->scale = local_1c + this->scale;
      local_20 = this->precision;
      do {
        iVar1 = local_20;
        local_20 = iVar1 + -1;
        bVar3 = false;
        if (-1 < local_20) {
          iVar2 = getDigitPos(this,local_20);
          bVar3 = iVar2 == '\0';
        }
      } while (bVar3);
      this->precision = iVar1;
    }
  }
  else {
    delta_1 = 0;
    while( true ) {
      bVar3 = false;
      if (delta_1 < this->precision) {
        bVar3 = (this->fBCD).bcdBytes.ptr[delta_1] == '\0';
      }
      if (!bVar3) break;
      delta_1 = delta_1 + 1;
    }
    if (delta_1 == this->precision) {
      setBcdToZero(this);
    }
    else {
      shiftRight(this,delta_1);
      leading_1 = this->precision;
      do {
        iVar1 = leading_1;
        leading_1 = iVar1 + -1;
        bVar3 = false;
        if (-1 < leading_1) {
          bVar3 = (this->fBCD).bcdBytes.ptr[leading_1] == '\0';
        }
      } while (bVar3);
      this->precision = iVar1;
      if (this->precision < 0x11) {
        switchStorage(this);
      }
    }
  }
  return;
}

Assistant:

void DecimalQuantity::compact() {
    if (usingBytes) {
        int32_t delta = 0;
        for (; delta < precision && fBCD.bcdBytes.ptr[delta] == 0; delta++);
        if (delta == precision) {
            // Number is zero
            setBcdToZero();
            return;
        } else {
            // Remove trailing zeros
            shiftRight(delta);
        }

        // Compute precision
        int32_t leading = precision - 1;
        for (; leading >= 0 && fBCD.bcdBytes.ptr[leading] == 0; leading--);
        precision = leading + 1;

        // Switch storage mechanism if possible
        if (precision <= 16) {
            switchStorage();
        }

    } else {
        if (fBCD.bcdLong == 0L) {
            // Number is zero
            setBcdToZero();
            return;
        }

        // Compact the number (remove trailing zeros)
        // TODO: Use a more efficient algorithm here and below. There is a logarithmic one.
        int32_t delta = 0;
        for (; delta < precision && getDigitPos(delta) == 0; delta++);
        fBCD.bcdLong >>= delta * 4;
        scale += delta;

        // Compute precision
        int32_t leading = precision - 1;
        for (; leading >= 0 && getDigitPos(leading) == 0; leading--);
        precision = leading + 1;
    }
}